

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxmatfx.cpp
# Opt level: O0

ObjPipeline * rw::xbox::makeMatFXPipeline(void)

{
  ObjPipeline *pOVar1;
  ObjPipeline *pipe;
  
  pOVar1 = ObjPipeline::create();
  pOVar1->instanceCB = defaultInstanceCB;
  pOVar1->uninstanceCB = defaultUninstanceCB;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginID = 0x120;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginData = 0;
  return pOVar1;
}

Assistant:

ObjPipeline*
makeMatFXPipeline(void)
{
	ObjPipeline *pipe = ObjPipeline::create();
	pipe->instanceCB = defaultInstanceCB;
	pipe->uninstanceCB = defaultUninstanceCB;
	pipe->pluginID = ID_MATFX;
	pipe->pluginData = 0;
	return pipe;
}